

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

uint32_t WriteBinaryMesh(aiMesh *mesh)

{
  uint uVar1;
  uint uVar2;
  aiVector3t<float> *paVar3;
  aiColor4t<float> *in;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  uint n;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  aiFace *paVar17;
  uint n_2;
  bool bVar18;
  uint32_t t;
  uint local_3c;
  long local_38;
  
  local_3c = 0x1237;
  fwrite(&local_3c,4,1,(FILE *)out);
  fwrite(&local_3c,4,1,(FILE *)out);
  lVar9 = ftell((FILE *)out);
  local_3c = mesh->mPrimitiveTypes;
  fwrite(&local_3c,4,1,(FILE *)out);
  local_3c = mesh->mNumVertices;
  fwrite(&local_3c,4,1,(FILE *)out);
  local_3c = mesh->mNumFaces;
  fwrite(&local_3c,4,1,(FILE *)out);
  local_3c = mesh->mNumBones;
  fwrite(&local_3c,4,1,(FILE *)out);
  local_3c = mesh->mMaterialIndex;
  fwrite(&local_3c,4,1,(FILE *)out);
  bVar18 = mesh->mVertices != (aiVector3D *)0x0;
  uVar14 = bVar18 + 2;
  if (mesh->mNormals == (aiVector3D *)0x0) {
    uVar14 = (uint)bVar18;
  }
  local_3c = uVar14;
  if ((mesh->mTangents != (aiVector3D *)0x0) &&
     (local_3c = uVar14 + 4, mesh->mBitangents == (aiVector3D *)0x0)) {
    local_3c = uVar14;
  }
  lVar12 = 0;
  do {
    if (mesh->mTextureCoords[lVar12] == (aiVector3D *)0x0) break;
    local_3c = local_3c | 0x100 << ((byte)lVar12 & 0x1f);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  lVar12 = 0;
  do {
    if (mesh->mColors[lVar12] == (aiColor4D *)0x0) break;
    local_3c = local_3c | 0x10000 << ((byte)lVar12 & 0x1f);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  fwrite(&local_3c,4,1,(FILE *)out);
  paVar3 = mesh->mVertices;
  if (paVar3 == (aiVector3t<float> *)0x0) {
    uVar4 = 0x18;
  }
  else {
    if (shortened == true) {
      uVar4 = WriteBounds<aiVector3t<float>>(paVar3,mesh->mNumVertices);
    }
    else {
      sVar11 = fwrite(paVar3,1,(ulong)(mesh->mNumVertices * 0xc),(FILE *)out);
      uVar4 = (uint32_t)sVar11;
    }
    uVar4 = uVar4 + 0x18;
  }
  paVar3 = mesh->mNormals;
  if (paVar3 != (aiVector3t<float> *)0x0) {
    if (shortened == true) {
      uVar5 = WriteBounds<aiVector3t<float>>(paVar3,mesh->mNumVertices);
      uVar4 = uVar5 + uVar4;
    }
    else {
      sVar11 = fwrite(paVar3,1,(ulong)(mesh->mNumVertices * 0xc),(FILE *)out);
      uVar4 = uVar4 + (int)sVar11;
    }
  }
  paVar3 = mesh->mTangents;
  local_38 = lVar9;
  if ((paVar3 != (aiVector3t<float> *)0x0) && (mesh->mBitangents != (aiVector3D *)0x0)) {
    if (shortened == true) {
      uVar5 = WriteBounds<aiVector3t<float>>(paVar3,mesh->mNumVertices);
      uVar6 = WriteBounds<aiVector3t<float>>(mesh->mBitangents,mesh->mNumVertices);
      uVar4 = uVar6 + uVar5 + uVar4;
    }
    else {
      sVar11 = fwrite(paVar3,1,(ulong)(mesh->mNumVertices * 0xc),(FILE *)out);
      sVar10 = fwrite(mesh->mBitangents,1,(ulong)(mesh->mNumVertices * 0xc),(FILE *)out);
      uVar4 = (int)sVar10 + uVar4 + (int)sVar11;
    }
  }
  lVar9 = 0;
  do {
    in = mesh->mColors[lVar9];
    if (in == (aiColor4t<float> *)0x0) break;
    if (shortened == true) {
      uVar5 = WriteBounds<aiColor4t<float>>(in,mesh->mNumVertices);
    }
    else {
      sVar11 = fwrite(in,(ulong)(mesh->mNumVertices << 4),1,(FILE *)out);
      uVar5 = (uint32_t)sVar11;
    }
    uVar4 = uVar4 + uVar5;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  lVar9 = -0x10;
  do {
    if (*(long *)(mesh->mNumUVComponents + lVar9) == 0) break;
    local_3c = *(uint *)((mesh->mName).data + lVar9 * 2 + -0x20);
    fwrite(&local_3c,4,1,(FILE *)out);
    if (shortened == true) {
      uVar5 = WriteBounds<aiVector3t<float>>
                        (*(aiVector3t<float> **)(mesh->mNumUVComponents + lVar9),mesh->mNumVertices)
      ;
    }
    else {
      sVar11 = fwrite(*(aiVector3t<float> **)(mesh->mNumUVComponents + lVar9),
                      (ulong)(mesh->mNumVertices * 0xc),1,(FILE *)out);
      uVar5 = (uint32_t)sVar11;
    }
    uVar4 = uVar4 + 4 + uVar5;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0);
  uVar14 = mesh->mNumFaces;
  if (shortened == false) {
    if (uVar14 != 0) {
      uVar13 = 0;
      do {
        paVar17 = mesh->mFaces;
        local_3c = CONCAT22(local_3c._2_2_,(short)paVar17[uVar13].mNumIndices);
        fwrite(&local_3c,2,1,(FILE *)out);
        uVar4 = uVar4 + 2;
        if (paVar17[uVar13].mNumIndices != 0) {
          paVar17 = paVar17 + uVar13;
          uVar16 = 0;
          do {
            if (mesh->mNumVertices < 0x10000) {
              local_3c = CONCAT22(local_3c._2_2_,(short)paVar17->mIndices[uVar16]);
              fwrite(&local_3c,2,1,(FILE *)out);
              iVar8 = 2;
            }
            else {
              local_3c = paVar17->mIndices[uVar16];
              fwrite(&local_3c,4,1,(FILE *)out);
              iVar8 = 4;
            }
            uVar4 = uVar4 + iVar8;
            uVar16 = uVar16 + 1;
          } while (uVar16 < paVar17->mNumIndices);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < mesh->mNumFaces);
    }
  }
  else if (uVar14 != 0) {
    if (0x1ff < uVar14) {
      uVar14 = 0x200;
    }
    uVar7 = 0;
    do {
      local_3c = 0;
      if (uVar14 != 0) {
        uVar13 = 0;
        local_3c = 0;
        do {
          uVar15 = uVar7 + (int)uVar13;
          uVar1 = mesh->mFaces[uVar15].mNumIndices;
          local_3c = (uVar1 & 0xffff) + local_3c;
          local_3c = local_3c * 0x10000 ^ uVar1 >> 5 & 0x7fff800 ^ local_3c;
          local_3c = (local_3c >> 0xb) + local_3c;
          local_3c = local_3c * 8 ^ local_3c;
          local_3c = (local_3c >> 5) + local_3c;
          local_3c = local_3c * 0x10 ^ local_3c;
          local_3c = (local_3c >> 0x11) + local_3c;
          local_3c = local_3c * 0x2000000 ^ local_3c;
          local_3c = (local_3c >> 6) + local_3c;
          if ((ulong)uVar1 != 0) {
            uVar16 = 0;
            do {
              uVar2 = mesh->mFaces[uVar15].mIndices[uVar16];
              local_3c = (uVar2 & 0xffff) + local_3c;
              local_3c = local_3c * 0x10000 ^ uVar2 >> 5 & 0x7fff800 ^ local_3c;
              local_3c = (local_3c >> 0xb) + local_3c;
              local_3c = local_3c * 8 ^ local_3c;
              local_3c = (local_3c >> 5) + local_3c;
              local_3c = local_3c * 0x10 ^ local_3c;
              local_3c = (local_3c >> 0x11) + local_3c;
              local_3c = local_3c * 0x2000000 ^ local_3c;
              local_3c = (local_3c >> 6) + local_3c;
              uVar16 = uVar16 + 1;
            } while (uVar1 != uVar16);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar14);
      }
      fwrite(&local_3c,4,1,(FILE *)out);
      uVar4 = uVar4 + 4;
      uVar7 = uVar14 + uVar7;
      uVar14 = mesh->mNumFaces - uVar7;
      if (0x1ff < uVar14) {
        uVar14 = 0x200;
      }
    } while (mesh->mNumFaces != uVar7);
  }
  if (mesh->mNumBones != 0) {
    uVar13 = 0;
    do {
      uVar5 = WriteBinaryBone(mesh->mBones[uVar13]);
      uVar4 = uVar4 + uVar5 + 8;
      uVar13 = uVar13 + 1;
    } while (uVar13 < mesh->mNumBones);
  }
  ChangeInteger((int)local_38 - 4,uVar4);
  return uVar4;
}

Assistant:

uint32_t WriteBinaryMesh(const aiMesh* mesh)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIMESH);

	len += Write<unsigned int>(mesh->mPrimitiveTypes);
	len += Write<unsigned int>(mesh->mNumVertices);
	len += Write<unsigned int>(mesh->mNumFaces);
	len += Write<unsigned int>(mesh->mNumBones);
	len += Write<unsigned int>(mesh->mMaterialIndex);

	// first of all, write bits for all existent vertex components
	unsigned int c = 0;
	if (mesh->mVertices) {
		c |= ASSBIN_MESH_HAS_POSITIONS;
	}
	if (mesh->mNormals) {
		c |= ASSBIN_MESH_HAS_NORMALS;
	}
	if (mesh->mTangents && mesh->mBitangents) {
		c |= ASSBIN_MESH_HAS_TANGENTS_AND_BITANGENTS;
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
		if (!mesh->mTextureCoords[n]) {
			break;
		}
		c |= ASSBIN_MESH_HAS_TEXCOORD(n);
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
		if (!mesh->mColors[n]) {
			break;
		}
		c |= ASSBIN_MESH_HAS_COLOR(n);
	}
	len += Write<unsigned int>(c);

	aiVector3D minVec, maxVec;
	if (mesh->mVertices) {
		if (shortened) {
			len += WriteBounds(mesh->mVertices,mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mVertices,1,12*mesh->mNumVertices,out));
	}
	if (mesh->mNormals) {
		if (shortened) {
			len += WriteBounds(mesh->mNormals,mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mNormals,1,12*mesh->mNumVertices,out));
	}
	if (mesh->mTangents && mesh->mBitangents) {
		if (shortened) {
			len += WriteBounds(mesh->mTangents,mesh->mNumVertices);
			len += WriteBounds(mesh->mBitangents,mesh->mNumVertices);
		} // else write as usual
		else {
			len += static_cast<uint32_t>(fwrite(mesh->mTangents,1,12*mesh->mNumVertices,out));
			len += static_cast<uint32_t>(fwrite(mesh->mBitangents,1,12*mesh->mNumVertices,out));
		}
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
		if (!mesh->mColors[n])
			break;

		if (shortened) {
			len += WriteBounds(mesh->mColors[n],mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mColors[n],16*mesh->mNumVertices,1,out));
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
		if (!mesh->mTextureCoords[n])
			break;

		// write number of UV components
		len += Write<unsigned int>(mesh->mNumUVComponents[n]);

		if (shortened) {
			len += WriteBounds(mesh->mTextureCoords[n],mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mTextureCoords[n],12*mesh->mNumVertices,1,out));
	}

	// write faces. There are no floating-point calculations involved
	// in these, so we can write a simple hash over the face data
	// to the dump file. We generate a single 32 Bit hash for 512 faces
	// using Assimp's standard hashing function.
	if (shortened) {
		unsigned int processed = 0;
		for (unsigned int job;(job = std::min(mesh->mNumFaces-processed,512u));processed += job) {

			uint32_t hash = 0;
			for (unsigned int a = 0; a < job;++a) {

				const aiFace& f = mesh->mFaces[processed+a];
				uint32_t tmp = f.mNumIndices;
				hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
				for (unsigned int i = 0; i < f.mNumIndices; ++i) {
					static_assert(AI_MAX_VERTICES <= 0xffffffff, "AI_MAX_VERTICES <= 0xffffffff");
					tmp = static_cast<uint32_t>( f.mIndices[i] );
					hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
				}
			}
			len += Write<unsigned int>(hash);
		}
	}
	else // else write as usual
	{
		// if there are less than 2^16 vertices, we can simply use 16 bit integers ...
		for (unsigned int i = 0; i < mesh->mNumFaces;++i) {
			const aiFace& f = mesh->mFaces[i];

			static_assert(AI_MAX_FACE_INDICES <= 0xffff, "AI_MAX_FACE_INDICES <= 0xffff");
			len += Write<uint16_t>(f.mNumIndices);

			for (unsigned int a = 0; a < f.mNumIndices;++a) {
				if (mesh->mNumVertices < (1u<<16)) {
					len += Write<uint16_t>(f.mIndices[a]);
				}
				else len += Write<unsigned int>(f.mIndices[a]);
			}
		}
	}

	// write bones
	if (mesh->mNumBones) {
		for (unsigned int a = 0; a < mesh->mNumBones;++a) {
			const aiBone* b = mesh->mBones[a];
			len += WriteBinaryBone(b)+8;
		}
	}

	ChangeInteger(old,len);
	return len;
}